

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O3

uint8 * google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                  (UnknownFieldSet *unknown_fields,uint8 *target,EpsCopyOutputStream *stream)

{
  uint32 uVar1;
  anon_union_8_5_912831f5_for_data_ aVar2;
  string *s;
  size_t __n;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  pointer pUVar9;
  long lVar10;
  byte *pbVar11;
  anon_union_8_5_912831f5_for_data_ *paVar12;
  uint32 *puVar13;
  anon_union_8_5_912831f5_for_data_ *paVar14;
  uint32 *puVar15;
  byte *pbVar16;
  
  pUVar9 = (unknown_fields->fields_).
           super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(unknown_fields->fields_).
                              super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar9) >> 4)) {
    lVar10 = 0;
    do {
      if ((anon_union_8_5_912831f5_for_data_ *)stream->end_ <= target) {
        target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      pUVar9 = pUVar9 + lVar10;
      switch(pUVar9->type_) {
      case 0:
        uVar6 = (pUVar9->data_).varint_;
        uVar5 = pUVar9->number_ << 3;
        if (uVar5 < 0x80) {
          *target = (byte)uVar5;
          pbVar11 = (byte *)((long)target + 1);
        }
        else {
          *target = (byte)uVar5 | 0x80;
          if (uVar5 < 0x4000) {
            *(byte *)((long)target + 1) = (byte)(uVar5 >> 7);
            pbVar11 = (byte *)((long)target + 2);
          }
          else {
            pbVar11 = (byte *)((long)target + 2);
            uVar5 = uVar5 >> 7;
            do {
              pbVar16 = pbVar11;
              pbVar16[-1] = (byte)uVar5 | 0x80;
              uVar4 = uVar5 >> 7;
              pbVar11 = pbVar16 + 1;
              bVar3 = 0x3fff < uVar5;
              uVar5 = uVar4;
            } while (bVar3);
            *pbVar16 = (byte)uVar4;
          }
        }
        if (uVar6 < 0x80) {
          *pbVar11 = (byte)uVar6;
LAB_002b0a77:
          target = pbVar11 + 1;
        }
        else {
          *pbVar11 = (byte)uVar6 | 0x80;
          if (uVar6 < 0x4000) {
            pbVar11[1] = (byte)(uVar6 >> 7);
LAB_002b0a97:
            target = pbVar11 + 2;
          }
          else {
            uVar6 = uVar6 >> 7;
            target = (uint8 *)(pbVar11 + 2);
            do {
              paVar12 = (anon_union_8_5_912831f5_for_data_ *)target;
              *(byte *)((long)paVar12 + -1) = (byte)uVar6 | 0x80;
              uVar7 = uVar6 >> 7;
              target = (uint8 *)((long)paVar12 + 1);
              bVar3 = 0x3fff < uVar6;
              uVar6 = uVar7;
            } while (bVar3);
            *(byte *)paVar12 = (byte)uVar7;
          }
        }
        break;
      case 1:
        uVar1 = (pUVar9->data_).fixed32_;
        uVar5 = pUVar9->number_ << 3;
        if (uVar5 < 0x80) {
          *target = (byte)uVar5 | 5;
          puVar13 = (uint32 *)((long)target + 1);
        }
        else {
          *target = (byte)uVar5 | 0x85;
          if (uVar5 < 0x4000) {
            *(byte *)((long)target + 1) = (byte)(uVar5 >> 7);
            puVar13 = (uint32 *)((long)target + 2);
          }
          else {
            puVar13 = (uint32 *)((long)target + 2);
            uVar5 = uVar5 >> 7;
            do {
              puVar15 = puVar13;
              *(byte *)((long)puVar15 + -1) = (byte)uVar5 | 0x80;
              uVar4 = uVar5 >> 7;
              puVar13 = (uint32 *)((long)puVar15 + 1);
              bVar3 = 0x3fff < uVar5;
              uVar5 = uVar4;
            } while (bVar3);
            *(byte *)puVar15 = (byte)uVar4;
          }
        }
        *puVar13 = uVar1;
        target = (uint8 *)(puVar13 + 1);
        break;
      case 2:
        aVar2 = pUVar9->data_;
        uVar5 = pUVar9->number_ << 3;
        if (uVar5 < 0x80) {
          *target = (byte)uVar5 | 1;
          paVar12 = (anon_union_8_5_912831f5_for_data_ *)((long)target + 1);
        }
        else {
          *target = (byte)uVar5 | 0x81;
          if (uVar5 < 0x4000) {
            *(byte *)((long)target + 1) = (byte)(uVar5 >> 7);
            paVar12 = (anon_union_8_5_912831f5_for_data_ *)((long)target + 2);
          }
          else {
            paVar12 = (anon_union_8_5_912831f5_for_data_ *)((long)target + 2);
            uVar5 = uVar5 >> 7;
            do {
              paVar14 = paVar12;
              *(byte *)((long)paVar14 + -1) = (byte)uVar5 | 0x80;
              uVar4 = uVar5 >> 7;
              paVar12 = (anon_union_8_5_912831f5_for_data_ *)((long)paVar14 + 1);
              bVar3 = 0x3fff < uVar5;
              uVar5 = uVar4;
            } while (bVar3);
            *(byte *)paVar14 = (byte)uVar4;
          }
        }
        *paVar12 = aVar2;
        target = (uint8 *)(paVar12 + 1);
        break;
      case 3:
        s = (string *)(pUVar9->data_).group_;
        __n = s->_M_string_length;
        if ((long)__n < 0x80) {
          uVar5 = pUVar9->number_ * 8;
          if (uVar5 < 0x80) {
            if ((long)(stream->end_ + (0xe - (long)target)) < (long)__n) goto LAB_002b0b64;
LAB_002b0967:
            *target = (byte)uVar5 | 2;
            pbVar11 = (byte *)((long)target + 1);
          }
          else {
            lVar8 = 2;
            if ((0x3fff < uVar5) && (lVar8 = 3, 0x1fffff < uVar5)) {
              lVar8 = 5 - (ulong)(uVar5 < 0x10000000);
            }
            if ((long)(stream->end_ + ~(ulong)(lVar8 + (long)target) + 0x10) < (long)__n)
            goto LAB_002b0b64;
            if (uVar5 < 0x80) goto LAB_002b0967;
            *target = (byte)uVar5 | 0x82;
            if (uVar5 < 0x4000) {
              *(byte *)((long)target + 1) = (byte)(uVar5 >> 7);
              pbVar11 = (byte *)((long)target + 2);
            }
            else {
              pbVar11 = (byte *)((long)target + 2);
              uVar5 = uVar5 >> 7;
              do {
                pbVar16 = pbVar11;
                pbVar16[-1] = (byte)uVar5 | 0x80;
                uVar4 = uVar5 >> 7;
                pbVar11 = pbVar16 + 1;
                bVar3 = 0x3fff < uVar5;
                uVar5 = uVar4;
              } while (bVar3);
              *pbVar16 = (byte)uVar4;
            }
          }
          *pbVar11 = (byte)__n;
          memcpy(pbVar11 + 1,(s->_M_dataplus)._M_p,__n);
          target = pbVar11 + __n + 1;
        }
        else {
LAB_002b0b64:
          target = io::EpsCopyOutputStream::WriteStringOutline(stream,pUVar9->number_,s,target);
        }
        break;
      case 4:
        uVar5 = pUVar9->number_ << 3;
        if (uVar5 < 0x80) {
          *target = (byte)uVar5 | 3;
          pbVar11 = (byte *)((long)target + 1);
        }
        else {
          *target = (byte)uVar5 | 0x83;
          if (uVar5 < 0x4000) {
            *(byte *)((long)target + 1) = (byte)(uVar5 >> 7);
            pbVar11 = (byte *)((long)target + 2);
          }
          else {
            pbVar11 = (byte *)((long)target + 2);
            uVar5 = uVar5 >> 7;
            do {
              pbVar16 = pbVar11;
              pbVar16[-1] = (byte)uVar5 | 0x80;
              uVar4 = uVar5 >> 7;
              pbVar11 = pbVar16 + 1;
              bVar3 = 0x3fff < uVar5;
              uVar5 = uVar4;
            } while (bVar3);
            *pbVar16 = (byte)uVar4;
          }
        }
        pbVar11 = InternalSerializeUnknownFieldsToArray((pUVar9->data_).group_,pbVar11,stream);
        if (stream->end_ <= pbVar11) {
          pbVar11 = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,pbVar11);
        }
        uVar5 = pUVar9->number_ << 3;
        if (uVar5 < 0x80) {
          *pbVar11 = (byte)uVar5 | 4;
          goto LAB_002b0a77;
        }
        *pbVar11 = (byte)uVar5 | 0x84;
        if (uVar5 < 0x4000) {
          pbVar11[1] = (byte)(uVar5 >> 7);
          goto LAB_002b0a97;
        }
        target = (uint8 *)(pbVar11 + 2);
        uVar5 = uVar5 >> 7;
        do {
          paVar12 = (anon_union_8_5_912831f5_for_data_ *)target;
          *(byte *)((long)paVar12 + -1) = (byte)uVar5 | 0x80;
          uVar4 = uVar5 >> 7;
          target = (uint8 *)((long)paVar12 + 1);
          bVar3 = 0x3fff < uVar5;
          uVar5 = uVar4;
        } while (bVar3);
        *(byte *)paVar12 = (byte)uVar4;
      }
      lVar10 = lVar10 + 1;
      pUVar9 = (unknown_fields->fields_).
               super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (lVar10 < (int)((ulong)((long)(unknown_fields->fields_).
                                          super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar9)
                           >> 4));
  }
  return (uint8 *)(anon_union_8_5_912831f5_for_data_ *)target;
}

Assistant:

uint8* WireFormat::InternalSerializeUnknownFieldsToArray(
    const UnknownFieldSet& unknown_fields, uint8* target,
    io::EpsCopyOutputStream* stream) {
  for (int i = 0; i < unknown_fields.field_count(); i++) {
    const UnknownField& field = unknown_fields.field(i);

    stream->EnsureSpace(&target);
    switch (field.type()) {
      case UnknownField::TYPE_VARINT:
        target = WireFormatLite::WriteUInt64ToArray(field.number(),
                                                    field.varint(), target);
        break;
      case UnknownField::TYPE_FIXED32:
        target = WireFormatLite::WriteFixed32ToArray(field.number(),
                                                     field.fixed32(), target);
        break;
      case UnknownField::TYPE_FIXED64:
        target = WireFormatLite::WriteFixed64ToArray(field.number(),
                                                     field.fixed64(), target);
        break;
      case UnknownField::TYPE_LENGTH_DELIMITED:
        target = stream->WriteString(field.number(), field.length_delimited(),
                                     target);
        break;
      case UnknownField::TYPE_GROUP:
        target = WireFormatLite::WriteTagToArray(
            field.number(), WireFormatLite::WIRETYPE_START_GROUP, target);
        target = InternalSerializeUnknownFieldsToArray(field.group(), target,
                                                       stream);
        stream->EnsureSpace(&target);
        target = WireFormatLite::WriteTagToArray(
            field.number(), WireFormatLite::WIRETYPE_END_GROUP, target);
        break;
    }
  }
  return target;
}